

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track-heuristic-partition-matching.cxx
# Opt level: O1

Parameters * parseCommandLine(Parameters *__return_storage_ptr__,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  size_type *psVar4;
  size_type *psVar5;
  size_type *psVar6;
  double dVar7;
  pointer pcVar8;
  unsigned_long val;
  char **argv_00;
  ostream *poVar9;
  long *plVar10;
  runtime_error *this;
  char *pcVar11;
  string local_a18;
  string local_9f8;
  string local_9d8;
  double *local_9b8;
  char **local_9b0;
  SwitchArg argBifurcationConstraint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  ValueArg<unsigned_long> argMaxDistance;
  ValueArg<double> argBiasSpatial;
  ValueArg<double> argBirthCost;
  ValueArg<double> argTerminationCost;
  ValueArg<double> argBiasTemporal;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argSolutionName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argNodesFileName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argEdgesFileName;
  CmdLine tclap;
  
  (__return_storage_ptr__->edgesFileName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->edgesFileName).field_2;
  (__return_storage_ptr__->edgesFileName)._M_string_length = 0;
  (__return_storage_ptr__->edgesFileName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->nodesFileName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nodesFileName).field_2;
  (__return_storage_ptr__->nodesFileName)._M_string_length = 0;
  (__return_storage_ptr__->nodesFileName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->solutionName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->solutionName).field_2;
  (__return_storage_ptr__->solutionName)._M_string_length = 0;
  (__return_storage_ptr__->solutionName).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->biasSpatial = 0.5;
  __return_storage_ptr__->biasTemporal = 0.5;
  __return_storage_ptr__->terminationCost = 0.0;
  __return_storage_ptr__->birthCost = 0.0;
  __return_storage_ptr__->bifurcationConstraint = false;
  __return_storage_ptr__->maxDistance = 0xffffffffffffffff;
  psVar3 = &argNodesFileName.super_Arg._flag._M_string_length;
  argNodesFileName.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argNodesFileName,"track","");
  psVar4 = &argEdgesFileName.super_Arg._flag._M_string_length;
  argEdgesFileName.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argEdgesFileName,"1.0","");
  TCLAP::CmdLine::CmdLine(&tclap,(string *)&argNodesFileName,' ',(string *)&argEdgesFileName,true);
  if (argEdgesFileName.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argEdgesFileName.super_Arg._vptr_Arg,
                    argEdgesFileName.super_Arg._flag._M_string_length + 1);
  }
  if (argNodesFileName.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argNodesFileName.super_Arg._vptr_Arg,
                    argNodesFileName.super_Arg._flag._M_string_length + 1);
  }
  argEdgesFileName.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argEdgesFileName,"n","");
  argSolutionName.super_Arg._vptr_Arg =
       (_func_int **)&argSolutionName.super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argSolutionName,"nodes-file","");
  argBiasSpatial.super_Arg._vptr_Arg =
       (_func_int **)&argBiasSpatial.super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBiasSpatial,"nodes information","");
  pcVar8 = (__return_storage_ptr__->nodesFileName)._M_dataplus._M_p;
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8c0,pcVar8,
             pcVar8 + (__return_storage_ptr__->nodesFileName)._M_string_length);
  psVar3 = &argBiasTemporal.super_Arg._flag._M_string_length;
  argBiasTemporal.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBiasTemporal,"nodes-file","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argNodesFileName,(string *)&argEdgesFileName,(string *)&argSolutionName,
             (string *)&argBiasSpatial,true,&local_8c0,(string *)&argBiasTemporal,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  if (argBiasTemporal.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBiasTemporal.super_Arg._vptr_Arg,
                    argBiasTemporal.super_Arg._flag._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
  }
  psVar5 = &argBiasSpatial.super_Arg._flag._M_string_length;
  if (argBiasSpatial.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argBiasSpatial.super_Arg._vptr_Arg,
                    argBiasSpatial.super_Arg._flag._M_string_length + 1);
  }
  if (argSolutionName.super_Arg._vptr_Arg !=
      (_func_int **)&argSolutionName.super_Arg._flag._M_string_length) {
    operator_delete(argSolutionName.super_Arg._vptr_Arg,
                    argSolutionName.super_Arg._flag._M_string_length + 1);
  }
  if (argEdgesFileName.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argEdgesFileName.super_Arg._vptr_Arg,
                    argEdgesFileName.super_Arg._flag._M_string_length + 1);
  }
  argSolutionName.super_Arg._vptr_Arg =
       (_func_int **)&argSolutionName.super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argSolutionName,"e","");
  argBiasSpatial.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBiasSpatial,"edges-file","");
  argBiasTemporal.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBiasTemporal,"edges information","")
  ;
  pcVar8 = (__return_storage_ptr__->edgesFileName)._M_dataplus._M_p;
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8e0,pcVar8,
             pcVar8 + (__return_storage_ptr__->edgesFileName)._M_string_length);
  psVar4 = &argTerminationCost.super_Arg._flag._M_string_length;
  argTerminationCost.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argTerminationCost,"edges-file","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argEdgesFileName,(string *)&argSolutionName,(string *)&argBiasSpatial,
             (string *)&argBiasTemporal,true,&local_8e0,(string *)&argTerminationCost,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  if (argTerminationCost.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argTerminationCost.super_Arg._vptr_Arg,
                    argTerminationCost.super_Arg._flag._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  psVar5 = &argBiasSpatial.super_Arg._flag._M_string_length;
  if (argBiasTemporal.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBiasTemporal.super_Arg._vptr_Arg,
                    argBiasTemporal.super_Arg._flag._M_string_length + 1);
  }
  if (argBiasSpatial.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argBiasSpatial.super_Arg._vptr_Arg,
                    argBiasSpatial.super_Arg._flag._M_string_length + 1);
  }
  if (argSolutionName.super_Arg._vptr_Arg !=
      (_func_int **)&argSolutionName.super_Arg._flag._M_string_length) {
    operator_delete(argSolutionName.super_Arg._vptr_Arg,
                    argSolutionName.super_Arg._flag._M_string_length + 1);
  }
  argBiasSpatial.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBiasSpatial,"s","");
  argBiasTemporal.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBiasTemporal,"solution-name","");
  local_9b0 = argv;
  argTerminationCost.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argTerminationCost,"solution name","");
  pcVar8 = (__return_storage_ptr__->solutionName)._M_dataplus._M_p;
  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_900,pcVar8,
             pcVar8 + (__return_storage_ptr__->solutionName)._M_string_length);
  psVar5 = &argBirthCost.super_Arg._flag._M_string_length;
  argBirthCost.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBirthCost,"solution-name","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argSolutionName,(string *)&argBiasSpatial,(string *)&argBiasTemporal,
             (string *)&argTerminationCost,true,&local_900,(string *)&argBirthCost,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  if (argBirthCost.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argBirthCost.super_Arg._vptr_Arg,
                    argBirthCost.super_Arg._flag._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
  }
  if (argTerminationCost.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argTerminationCost.super_Arg._vptr_Arg,
                    argTerminationCost.super_Arg._flag._M_string_length + 1);
  }
  if (argBiasTemporal.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBiasTemporal.super_Arg._vptr_Arg,
                    argBiasTemporal.super_Arg._flag._M_string_length + 1);
  }
  if (argBiasSpatial.super_Arg._vptr_Arg !=
      (_func_int **)&argBiasSpatial.super_Arg._flag._M_string_length) {
    operator_delete(argBiasSpatial.super_Arg._vptr_Arg,
                    argBiasSpatial.super_Arg._flag._M_string_length + 1);
  }
  argBiasTemporal.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBiasTemporal,"b","");
  argTerminationCost.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&argTerminationCost,"cut-prior-spatial","");
  argBirthCost.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBirthCost,"cut prior spatial","");
  dVar7 = __return_storage_ptr__->biasSpatial;
  psVar6 = &argMaxDistance.super_Arg._flag._M_string_length;
  argMaxDistance.super_Arg._vptr_Arg = (_func_int **)psVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argMaxDistance,"cut prior spatial","");
  TCLAP::ValueArg<double>::ValueArg
            (&argBiasSpatial,(string *)&argBiasTemporal,(string *)&argTerminationCost,
             (string *)&argBirthCost,false,dVar7,(string *)&argMaxDistance,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  if (argMaxDistance.super_Arg._vptr_Arg != (_func_int **)psVar6) {
    operator_delete(argMaxDistance.super_Arg._vptr_Arg,
                    argMaxDistance.super_Arg._flag._M_string_length + 1);
  }
  if (argBirthCost.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argBirthCost.super_Arg._vptr_Arg,
                    argBirthCost.super_Arg._flag._M_string_length + 1);
  }
  if (argTerminationCost.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argTerminationCost.super_Arg._vptr_Arg,
                    argTerminationCost.super_Arg._flag._M_string_length + 1);
  }
  if (argBiasTemporal.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBiasTemporal.super_Arg._vptr_Arg,
                    argBiasTemporal.super_Arg._flag._M_string_length + 1);
  }
  argTerminationCost.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argTerminationCost,"t","");
  argBirthCost.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBirthCost,"cut-prior-temporal","");
  argMaxDistance.super_Arg._vptr_Arg = (_func_int **)psVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argMaxDistance,"cut prior temporal","")
  ;
  dVar7 = __return_storage_ptr__->biasTemporal;
  psVar3 = &argBifurcationConstraint.super_Arg._flag._M_string_length;
  argBifurcationConstraint.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&argBifurcationConstraint,"cut prior temporal","");
  TCLAP::ValueArg<double>::ValueArg
            (&argBiasTemporal,(string *)&argTerminationCost,(string *)&argBirthCost,
             (string *)&argMaxDistance,false,dVar7,(string *)&argBifurcationConstraint,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  if (argBifurcationConstraint.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBifurcationConstraint.super_Arg._vptr_Arg,
                    argBifurcationConstraint.super_Arg._flag._M_string_length + 1);
  }
  if (argMaxDistance.super_Arg._vptr_Arg != (_func_int **)psVar6) {
    operator_delete(argMaxDistance.super_Arg._vptr_Arg,
                    argMaxDistance.super_Arg._flag._M_string_length + 1);
  }
  if (argBirthCost.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argBirthCost.super_Arg._vptr_Arg,
                    argBirthCost.super_Arg._flag._M_string_length + 1);
  }
  if (argTerminationCost.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argTerminationCost.super_Arg._vptr_Arg,
                    argTerminationCost.super_Arg._flag._M_string_length + 1);
  }
  argBirthCost.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBirthCost,"T","");
  argMaxDistance.super_Arg._vptr_Arg = (_func_int **)psVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argMaxDistance,"termination-cost","");
  argBifurcationConstraint.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&argBifurcationConstraint,"early termination cost","");
  local_9b8 = &__return_storage_ptr__->terminationCost;
  dVar7 = *local_9b8;
  paVar1 = &local_a18.field_2;
  local_a18._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"early termination cost","");
  TCLAP::ValueArg<double>::ValueArg
            (&argTerminationCost,(string *)&argBirthCost,(string *)&argMaxDistance,
             (string *)&argBifurcationConstraint,false,dVar7,&local_a18,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != paVar1) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if (argBifurcationConstraint.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBifurcationConstraint.super_Arg._vptr_Arg,
                    argBifurcationConstraint.super_Arg._flag._M_string_length + 1);
  }
  if (argMaxDistance.super_Arg._vptr_Arg != (_func_int **)psVar6) {
    operator_delete(argMaxDistance.super_Arg._vptr_Arg,
                    argMaxDistance.super_Arg._flag._M_string_length + 1);
  }
  if (argBirthCost.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argBirthCost.super_Arg._vptr_Arg,
                    argBirthCost.super_Arg._flag._M_string_length + 1);
  }
  argMaxDistance.super_Arg._vptr_Arg = (_func_int **)psVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argMaxDistance,"B","");
  argBifurcationConstraint.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&argBifurcationConstraint,"birth-cost","");
  local_a18._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"birth cost","");
  dVar7 = __return_storage_ptr__->birthCost;
  paVar2 = &local_9f8.field_2;
  local_9f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"birth cost","");
  TCLAP::ValueArg<double>::ValueArg
            (&argBirthCost,(string *)&argMaxDistance,(string *)&argBifurcationConstraint,&local_a18,
             false,dVar7,&local_9f8,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != paVar1) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if (argBifurcationConstraint.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBifurcationConstraint.super_Arg._vptr_Arg,
                    argBifurcationConstraint.super_Arg._flag._M_string_length + 1);
  }
  if (argMaxDistance.super_Arg._vptr_Arg != (_func_int **)psVar6) {
    operator_delete(argMaxDistance.super_Arg._vptr_Arg,
                    argMaxDistance.super_Arg._flag._M_string_length + 1);
  }
  argBifurcationConstraint.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argBifurcationConstraint,"L","");
  local_a18._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"max-dist","");
  local_9f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"maximum distance","");
  val = __return_storage_ptr__->maxDistance;
  paVar1 = &local_9d8.field_2;
  local_9d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"max dist","");
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&argMaxDistance,(string *)&argBifurcationConstraint,&local_a18,&local_9f8,false,val,
             &local_9d8,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if (argBifurcationConstraint.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argBifurcationConstraint.super_Arg._vptr_Arg,
                    argBifurcationConstraint.super_Arg._flag._M_string_length + 1);
  }
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"F","");
  local_9f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"bifurcation-constraint","");
  local_9d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d8,"Enforce bifurcation contraint. (Default: disabled).","");
  TCLAP::Arg::Arg(&argBifurcationConstraint.super_Arg,&local_a18,&local_9f8,&local_9d8,false,false,
                  (Visitor *)0x0);
  argBifurcationConstraint.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0014c280;
  argBifurcationConstraint.super_Arg._163_2_ = 0;
  (*tclap.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  argv_00 = local_9b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  TCLAP::CmdLine::parse(&tclap,argc,argv_00);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->nodesFileName);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->solutionName);
  __return_storage_ptr__->biasSpatial = argBiasSpatial._value;
  __return_storage_ptr__->biasTemporal = argBiasTemporal._value;
  __return_storage_ptr__->terminationCost = argTerminationCost._value;
  __return_storage_ptr__->birthCost = argBirthCost._value;
  __return_storage_ptr__->maxDistance = argMaxDistance._value;
  __return_storage_ptr__->bifurcationConstraint = (bool)argBifurcationConstraint.super_Arg._163_1_;
  if ((argBiasSpatial._value < 2.220446049250313e-16) ||
     (0.9999999999999998 < argBiasSpatial._value)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Spatial bias must be in the range (0, 1)");
  }
  else {
    if ((2.220446049250313e-16 <= argBiasTemporal._value) &&
       (argBiasTemporal._value <= 0.9999999999999998)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parameters:",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"- cut prior (spatial) : ",0x18);
      poVar9 = std::ostream::_M_insert<double>(__return_storage_ptr__->biasSpatial);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"- cut prior (temporal): ",0x18);
      poVar9 = std::ostream::_M_insert<double>(__return_storage_ptr__->biasTemporal);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"- cost of termination : ",0x18);
      poVar9 = std::ostream::_M_insert<double>(*local_9b8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"- cost of birth: ",0x11);
      poVar9 = std::ostream::_M_insert<double>(__return_storage_ptr__->birthCost);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"- bifurcation constraint: ",0x1a);
      pcVar11 = "no";
      if ((ulong)__return_storage_ptr__->bifurcationConstraint != 0) {
        pcVar11 = "yes";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,pcVar11,(ulong)__return_storage_ptr__->bifurcationConstraint | 2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"- locality (max distance): ",0x1b);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"- Solver: Hungarian matching",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      plVar10 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      argBifurcationConstraint.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0014c128;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBifurcationConstraint.super_Arg._requireLabel._M_dataplus._M_p !=
          &argBifurcationConstraint.super_Arg._requireLabel.field_2) {
        operator_delete(argBifurcationConstraint.super_Arg._requireLabel._M_dataplus._M_p,
                        argBifurcationConstraint.super_Arg._requireLabel.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBifurcationConstraint.super_Arg._description._M_dataplus._M_p !=
          &argBifurcationConstraint.super_Arg._description.field_2) {
        operator_delete(argBifurcationConstraint.super_Arg._description._M_dataplus._M_p,
                        argBifurcationConstraint.super_Arg._description.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBifurcationConstraint.super_Arg._name._M_dataplus._M_p !=
          &argBifurcationConstraint.super_Arg._name.field_2) {
        operator_delete(argBifurcationConstraint.super_Arg._name._M_dataplus._M_p,
                        argBifurcationConstraint.super_Arg._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBifurcationConstraint.super_Arg._flag._M_dataplus._M_p !=
          &argBifurcationConstraint.super_Arg._flag.field_2) {
        operator_delete(argBifurcationConstraint.super_Arg._flag._M_dataplus._M_p,
                        argBifurcationConstraint.super_Arg._flag.field_2._M_allocated_capacity + 1);
      }
      argMaxDistance.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0014c510;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argMaxDistance._typeDesc._M_dataplus._M_p != &argMaxDistance._typeDesc.field_2) {
        operator_delete(argMaxDistance._typeDesc._M_dataplus._M_p,
                        argMaxDistance._typeDesc.field_2._M_allocated_capacity + 1);
      }
      argMaxDistance.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0014c128;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argMaxDistance.super_Arg._requireLabel._M_dataplus._M_p !=
          &argMaxDistance.super_Arg._requireLabel.field_2) {
        operator_delete(argMaxDistance.super_Arg._requireLabel._M_dataplus._M_p,
                        argMaxDistance.super_Arg._requireLabel.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argMaxDistance.super_Arg._description._M_dataplus._M_p !=
          &argMaxDistance.super_Arg._description.field_2) {
        operator_delete(argMaxDistance.super_Arg._description._M_dataplus._M_p,
                        argMaxDistance.super_Arg._description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argMaxDistance.super_Arg._name._M_dataplus._M_p !=
          &argMaxDistance.super_Arg._name.field_2) {
        operator_delete(argMaxDistance.super_Arg._name._M_dataplus._M_p,
                        argMaxDistance.super_Arg._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argMaxDistance.super_Arg._flag._M_dataplus._M_p !=
          &argMaxDistance.super_Arg._flag.field_2) {
        operator_delete(argMaxDistance.super_Arg._flag._M_dataplus._M_p,
                        argMaxDistance.super_Arg._flag.field_2._M_allocated_capacity + 1);
      }
      argBirthCost.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0014c618;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBirthCost._typeDesc._M_dataplus._M_p != &argBirthCost._typeDesc.field_2) {
        operator_delete(argBirthCost._typeDesc._M_dataplus._M_p,
                        argBirthCost._typeDesc.field_2._M_allocated_capacity + 1);
      }
      argBirthCost.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0014c128;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBirthCost.super_Arg._requireLabel._M_dataplus._M_p !=
          &argBirthCost.super_Arg._requireLabel.field_2) {
        operator_delete(argBirthCost.super_Arg._requireLabel._M_dataplus._M_p,
                        argBirthCost.super_Arg._requireLabel.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBirthCost.super_Arg._description._M_dataplus._M_p !=
          &argBirthCost.super_Arg._description.field_2) {
        operator_delete(argBirthCost.super_Arg._description._M_dataplus._M_p,
                        argBirthCost.super_Arg._description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBirthCost.super_Arg._name._M_dataplus._M_p != &argBirthCost.super_Arg._name.field_2)
      {
        operator_delete(argBirthCost.super_Arg._name._M_dataplus._M_p,
                        argBirthCost.super_Arg._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBirthCost.super_Arg._flag._M_dataplus._M_p != &argBirthCost.super_Arg._flag.field_2)
      {
        operator_delete(argBirthCost.super_Arg._flag._M_dataplus._M_p,
                        argBirthCost.super_Arg._flag.field_2._M_allocated_capacity + 1);
      }
      argTerminationCost.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0014c618;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argTerminationCost._typeDesc._M_dataplus._M_p != &argTerminationCost._typeDesc.field_2)
      {
        operator_delete(argTerminationCost._typeDesc._M_dataplus._M_p,
                        argTerminationCost._typeDesc.field_2._M_allocated_capacity + 1);
      }
      argTerminationCost.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0014c128;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argTerminationCost.super_Arg._requireLabel._M_dataplus._M_p !=
          &argTerminationCost.super_Arg._requireLabel.field_2) {
        operator_delete(argTerminationCost.super_Arg._requireLabel._M_dataplus._M_p,
                        argTerminationCost.super_Arg._requireLabel.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argTerminationCost.super_Arg._description._M_dataplus._M_p !=
          &argTerminationCost.super_Arg._description.field_2) {
        operator_delete(argTerminationCost.super_Arg._description._M_dataplus._M_p,
                        argTerminationCost.super_Arg._description.field_2._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argTerminationCost.super_Arg._name._M_dataplus._M_p !=
          &argTerminationCost.super_Arg._name.field_2) {
        operator_delete(argTerminationCost.super_Arg._name._M_dataplus._M_p,
                        argTerminationCost.super_Arg._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argTerminationCost.super_Arg._flag._M_dataplus._M_p !=
          &argTerminationCost.super_Arg._flag.field_2) {
        operator_delete(argTerminationCost.super_Arg._flag._M_dataplus._M_p,
                        argTerminationCost.super_Arg._flag.field_2._M_allocated_capacity + 1);
      }
      argBiasTemporal.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0014c618;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasTemporal._typeDesc._M_dataplus._M_p != &argBiasTemporal._typeDesc.field_2) {
        operator_delete(argBiasTemporal._typeDesc._M_dataplus._M_p,
                        argBiasTemporal._typeDesc.field_2._M_allocated_capacity + 1);
      }
      argBiasTemporal.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0014c128;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasTemporal.super_Arg._requireLabel._M_dataplus._M_p !=
          &argBiasTemporal.super_Arg._requireLabel.field_2) {
        operator_delete(argBiasTemporal.super_Arg._requireLabel._M_dataplus._M_p,
                        argBiasTemporal.super_Arg._requireLabel.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasTemporal.super_Arg._description._M_dataplus._M_p !=
          &argBiasTemporal.super_Arg._description.field_2) {
        operator_delete(argBiasTemporal.super_Arg._description._M_dataplus._M_p,
                        argBiasTemporal.super_Arg._description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasTemporal.super_Arg._name._M_dataplus._M_p !=
          &argBiasTemporal.super_Arg._name.field_2) {
        operator_delete(argBiasTemporal.super_Arg._name._M_dataplus._M_p,
                        argBiasTemporal.super_Arg._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasTemporal.super_Arg._flag._M_dataplus._M_p !=
          &argBiasTemporal.super_Arg._flag.field_2) {
        operator_delete(argBiasTemporal.super_Arg._flag._M_dataplus._M_p,
                        argBiasTemporal.super_Arg._flag.field_2._M_allocated_capacity + 1);
      }
      argBiasSpatial.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0014c618;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasSpatial._typeDesc._M_dataplus._M_p != &argBiasSpatial._typeDesc.field_2) {
        operator_delete(argBiasSpatial._typeDesc._M_dataplus._M_p,
                        argBiasSpatial._typeDesc.field_2._M_allocated_capacity + 1);
      }
      argBiasSpatial.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0014c128;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasSpatial.super_Arg._requireLabel._M_dataplus._M_p !=
          &argBiasSpatial.super_Arg._requireLabel.field_2) {
        operator_delete(argBiasSpatial.super_Arg._requireLabel._M_dataplus._M_p,
                        argBiasSpatial.super_Arg._requireLabel.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasSpatial.super_Arg._description._M_dataplus._M_p !=
          &argBiasSpatial.super_Arg._description.field_2) {
        operator_delete(argBiasSpatial.super_Arg._description._M_dataplus._M_p,
                        argBiasSpatial.super_Arg._description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasSpatial.super_Arg._name._M_dataplus._M_p !=
          &argBiasSpatial.super_Arg._name.field_2) {
        operator_delete(argBiasSpatial.super_Arg._name._M_dataplus._M_p,
                        argBiasSpatial.super_Arg._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argBiasSpatial.super_Arg._flag._M_dataplus._M_p !=
          &argBiasSpatial.super_Arg._flag.field_2) {
        operator_delete(argBiasSpatial.super_Arg._flag._M_dataplus._M_p,
                        argBiasSpatial.super_Arg._flag.field_2._M_allocated_capacity + 1);
      }
      TCLAP::
      ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ValueArg(&argSolutionName);
      TCLAP::
      ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ValueArg(&argEdgesFileName);
      TCLAP::
      ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ValueArg(&argNodesFileName);
      TCLAP::CmdLine::~CmdLine(&tclap);
      return __return_storage_ptr__;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Temporal bias must be in the range (0, 1)");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Parameters
parseCommandLine(int argc, char** argv) try {
    Parameters parameters;

    TCLAP::CmdLine tclap("track", ' ', "1.0");
    TCLAP::ValueArg<std::string> argNodesFileName(
        "n", "nodes-file", "nodes information", true, parameters.nodesFileName,
        "nodes-file", tclap);
    TCLAP::ValueArg<std::string> argEdgesFileName(
        "e", "edges-file", "edges information", true, parameters.edgesFileName,
        "edges-file", tclap);
    TCLAP::ValueArg<std::string> argSolutionName(
        "s", "solution-name", "solution name", true, parameters.solutionName,
        "solution-name", tclap);
    TCLAP::ValueArg<double> argBiasSpatial(
        "b", "cut-prior-spatial", "cut prior spatial", false,
        parameters.biasSpatial, "cut prior spatial", tclap);
    TCLAP::ValueArg<double> argBiasTemporal(
        "t", "cut-prior-temporal", "cut prior temporal", false,
        parameters.biasTemporal, "cut prior temporal", tclap);
    TCLAP::ValueArg<double> argTerminationCost(
        "T", "termination-cost", "early termination cost", false,
        parameters.terminationCost, "early termination cost", tclap);
    TCLAP::ValueArg<double> argBirthCost("B", "birth-cost", "birth cost", false,
                                         parameters.birthCost, "birth cost",
                                         tclap);
    TCLAP::ValueArg<size_t> argMaxDistance("L", "max-dist", "maximum distance",
                                           false, parameters.maxDistance,
                                           "max dist", tclap);
    TCLAP::SwitchArg argBifurcationConstraint(
        "F", "bifurcation-constraint",
        "Enforce bifurcation contraint. (Default: disabled).", tclap);

    tclap.parse(argc, argv);

    parameters.edgesFileName = argEdgesFileName.getValue();
    parameters.nodesFileName = argNodesFileName.getValue();
    parameters.solutionName = argSolutionName.getValue();
    parameters.biasSpatial = argBiasSpatial.getValue();
    parameters.biasTemporal = argBiasTemporal.getValue();
    parameters.terminationCost = argTerminationCost.getValue();
    parameters.birthCost = argBirthCost.getValue();
    parameters.maxDistance = argMaxDistance.getValue();
    parameters.bifurcationConstraint = argBifurcationConstraint.getValue();

    if (parameters.biasSpatial < std::numeric_limits<double>::epsilon() ||
        parameters.biasSpatial > 1.0 - std::numeric_limits<double>::epsilon())
        throw std::runtime_error("Spatial bias must be in the range (0, 1)");

    if (parameters.biasTemporal < std::numeric_limits<double>::epsilon() ||
        parameters.biasTemporal > 1.0 - std::numeric_limits<double>::epsilon())
        throw std::runtime_error("Temporal bias must be in the range (0, 1)");

    std::cout << "parameters:" << std::endl
              << "- cut prior (spatial) : " << parameters.biasSpatial
              << std::endl
              << "- cut prior (temporal): " << parameters.biasTemporal
              << std::endl
              << "- cost of termination : " << parameters.terminationCost
              << std::endl
              << "- cost of birth: " << parameters.birthCost << std::endl
              << "- bifurcation constraint: "
              << (parameters.bifurcationConstraint ? "yes" : "no") << std::endl
              << "- locality (max distance): " << parameters.maxDistance
              << std::endl
              << "- Solver: Hungarian matching" << std::endl
              << std::endl;

    return parameters;
} catch (TCLAP::ArgException& e) {
    throw std::runtime_error(e.error());
}